

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMInteractionType.hpp
# Opt level: O2

void __thiscall OpenMD::EAMInteractionType::~EAMInteractionType(EAMInteractionType *this)

{
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__EAMInteractionType_002c3fa8;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->phi_).super__Vector_base<double,_std::allocator<double>_>);
  NonBondedInteractionType::~NonBondedInteractionType(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

EAMInteractionType(RealType re, RealType alpha, RealType beta, RealType A,
                       RealType B, RealType kappa, RealType lambda) {
      interactionType_ = eamitZhou;
      setEAMZhou();
      re_     = re;
      alpha_  = alpha;
      beta_   = beta;
      A_      = A;
      B_      = B;
      kappa_  = kappa;
      lambda_ = lambda;
    }